

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enum.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::objectivec::EnumGenerator::GenerateSource
          (EnumGenerator *this,Printer *printer)

{
  EnumValueDescriptor *this_00;
  long *plVar1;
  _Alloc_hider _Var2;
  Printer *pPVar3;
  bool bVar4;
  int iVar5;
  char *pcVar6;
  EnumValueDescriptor *in_RDX;
  EnumValueDescriptor *extraout_RDX;
  EnumValueDescriptor *extraout_RDX_00;
  EnumValueDescriptor *extraout_RDX_02;
  int32_t key;
  pointer ppEVar7;
  long lVar8;
  string_view desired_output;
  string_view name;
  string_view input_for_decode;
  __string_type __str;
  string text_blob;
  TextFormatDecodeData text_format_decode_data;
  string short_name;
  anon_class_1_0_00000001 local_699;
  EnumGenerator *local_698;
  string local_690;
  Printer *local_670;
  undefined1 *local_668;
  undefined8 local_660;
  undefined1 local_658;
  undefined7 uStack_657;
  undefined8 uStack_650;
  undefined1 *local_648;
  undefined8 local_640;
  undefined1 local_638;
  undefined7 uStack_637;
  undefined8 uStack_630;
  undefined1 *local_628;
  undefined8 local_620;
  undefined1 local_618;
  undefined7 uStack_617;
  undefined8 uStack_610;
  undefined1 *local_608;
  undefined8 local_600;
  undefined1 local_5f8;
  undefined7 uStack_5f7;
  undefined1 *apuStack_5f0 [2];
  long local_5e0;
  undefined1 local_5d8;
  undefined7 uStack_5d7;
  undefined1 auStack_5d0 [8];
  TextFormatDecodeData local_5c8;
  byte abStack_5b0 [8];
  string local_5a8;
  undefined1 local_588 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_578;
  string local_568;
  pointer local_548;
  char *local_540;
  Sub local_538;
  undefined1 *local_480;
  undefined8 local_478;
  undefined1 local_470 [8];
  undefined8 uStack_468;
  long *local_460;
  undefined8 local_458;
  code *local_450;
  code *local_448;
  undefined1 local_440;
  undefined1 *local_438;
  undefined8 local_430;
  undefined1 local_428 [16];
  undefined1 local_418;
  undefined1 local_3d0;
  undefined1 *local_3c8;
  undefined8 local_3c0;
  undefined1 local_3b8 [8];
  undefined8 uStack_3b0;
  undefined8 *local_3a8;
  undefined8 local_3a0;
  code *local_398;
  code *local_390;
  undefined1 local_388;
  undefined1 *local_380;
  undefined8 local_378;
  undefined1 local_370 [16];
  undefined1 local_360;
  undefined1 local_318;
  undefined1 *local_310;
  undefined8 local_308;
  undefined1 local_300 [8];
  undefined8 uStack_2f8;
  long *local_2f0;
  undefined8 local_2e8;
  code *local_2e0;
  code *local_2d8;
  undefined1 local_2d0;
  undefined1 *local_2c8;
  undefined8 local_2c0;
  undefined1 local_2b8 [16];
  undefined1 local_2a8;
  undefined1 local_260;
  Sub local_258;
  Sub local_1a0;
  undefined1 *local_e8;
  undefined8 local_e0;
  undefined1 local_d8 [8];
  undefined1 *puStack_d0;
  undefined8 *local_c8;
  undefined8 local_c0;
  code *local_b8;
  code *local_b0;
  undefined1 local_a8;
  undefined1 *local_a0;
  undefined8 local_98;
  undefined1 local_90 [16];
  undefined1 local_80;
  undefined1 local_38;
  EnumValueDescriptor *extraout_RDX_01;
  
  key = 0;
  local_5c8.entries_.
  super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_5c8.entries_.
  super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_5c8.entries_.
  super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  apuStack_5f0[1] = &local_5d8;
  local_5e0 = 0;
  local_5d8 = 0;
  ppEVar7 = (this->all_values_).
            super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_548 = (this->all_values_).
              super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  local_698 = this;
  local_670 = printer;
  if (ppEVar7 != local_548) {
    do {
      this_00 = *ppEVar7;
      EnumValueShortName_abi_cxx11_(&local_538.key_,(objectivec *)this_00,in_RDX);
      local_690._M_dataplus._M_p = (pointer)&local_690.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_690,local_538.key_._M_dataplus._M_p,
                 (objectivec *)
                 (local_538.key_._M_string_length + (long)local_538.key_._M_dataplus._M_p));
      pcVar6 = (char *)0x1;
      std::__cxx11::string::_M_replace_aux((ulong)&local_690,local_690._M_string_length,0,'\x01');
      std::__cxx11::string::_M_append((char *)(apuStack_5f0 + 1),(ulong)local_690._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_690._M_dataplus._M_p != &local_690.field_2) {
        operator_delete(local_690._M_dataplus._M_p,local_690.field_2._M_allocated_capacity + 1);
      }
      name._M_str = pcVar6;
      name._M_len = (size_t)local_538.key_._M_dataplus._M_p;
      UnCamelCaseEnumShortName_abi_cxx11_
                (&local_690,(objectivec *)local_538.key_._M_string_length,name);
      _Var2._M_p = local_690._M_dataplus._M_p;
      bVar4 = true;
      in_RDX = (EnumValueDescriptor *)local_690._M_string_length;
      if (((EnumValueDescriptor *)local_690._M_string_length ==
           (EnumValueDescriptor *)this_00->all_names_->_M_string_length) &&
         (((EnumValueDescriptor *)local_690._M_string_length == (EnumValueDescriptor *)0x0 ||
          (iVar5 = bcmp(local_690._M_dataplus._M_p,(this_00->all_names_->_M_dataplus)._M_p,
                        local_690._M_string_length), in_RDX = extraout_RDX, iVar5 == 0)))) {
        bVar4 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var2._M_p != &local_690.field_2) {
        operator_delete(_Var2._M_p,local_690.field_2._M_allocated_capacity + 1);
        in_RDX = extraout_RDX_00;
      }
      if (bVar4) {
        desired_output._M_str = (this_00->all_names_->_M_dataplus)._M_p;
        desired_output._M_len = this_00->all_names_->_M_string_length;
        input_for_decode._M_str = local_538.key_._M_dataplus._M_p;
        input_for_decode._M_len = local_538.key_._M_string_length;
        TextFormatDecodeData::AddString(&local_5c8,key,input_for_decode,desired_output);
        in_RDX = extraout_RDX_01;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_538.key_._M_dataplus._M_p != &local_538.key_.field_2) {
        operator_delete(local_538.key_._M_dataplus._M_p,
                        local_538.key_.field_2._M_allocated_capacity + 1);
        in_RDX = extraout_RDX_02;
      }
      ppEVar7 = ppEVar7 + 1;
      key = key + 1;
    } while (ppEVar7 != local_548);
  }
  pPVar3 = local_670;
  local_568._M_dataplus._M_p = (pointer)&local_568.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_568,"name","");
  io::Printer::Sub::Sub<std::__cxx11::string_const&>(&local_538,&local_568,&local_698->name_);
  local_628 = &local_618;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_628,"values_name_blob","");
  local_480 = local_470;
  if (local_628 == &local_618) {
    uStack_468 = uStack_610;
  }
  else {
    local_480 = local_628;
  }
  local_478 = local_620;
  local_620 = 0;
  local_618 = 0;
  local_628 = &local_618;
  local_460 = (long *)operator_new(0x18);
  *local_460 = (long)(apuStack_5f0 + 1);
  local_460[1] = (long)&local_670;
  *(undefined1 *)(local_460 + 2) = 0;
  local_448 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
              ::_M_invoke;
  local_458 = 0;
  local_450 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
              ::_M_manager;
  local_440 = 1;
  local_438 = local_428;
  local_430 = 0;
  local_428[0] = 0;
  local_418 = 0;
  std::__cxx11::string::_M_replace((ulong)&local_438,0,(char *)0x0,0x522f0c);
  local_3d0 = 0;
  local_648 = &local_638;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_648,"values","");
  local_3c8 = local_3b8;
  if (local_648 == &local_638) {
    uStack_3b0 = uStack_630;
  }
  else {
    local_3c8 = local_648;
  }
  local_3c0 = local_640;
  local_640 = 0;
  local_638 = 0;
  local_648 = &local_638;
  local_3a8 = (undefined8 *)operator_new(0x18);
  *local_3a8 = local_698;
  local_3a8[1] = &local_670;
  *(undefined1 *)(local_3a8 + 2) = 0;
  local_390 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
              ::_M_invoke;
  local_3a0 = 0;
  local_398 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
              ::_M_manager;
  local_388 = 1;
  local_380 = local_370;
  local_378 = 0;
  local_370[0] = 0;
  local_360 = 0;
  std::__cxx11::string::_M_replace((ulong)&local_380,0,(char *)0x0,0x522f0c);
  local_318 = 0;
  local_668 = &local_658;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_668,"maybe_extra_text_format_decl","");
  local_310 = local_300;
  if (local_668 == &local_658) {
    uStack_2f8 = uStack_650;
  }
  else {
    local_310 = local_668;
  }
  local_308 = local_660;
  local_660 = 0;
  local_658 = 0;
  local_668 = &local_658;
  local_2f0 = (long *)operator_new(0x18);
  *local_2f0 = (long)&local_5c8;
  local_2f0[1] = (long)&local_670;
  *(undefined1 *)(local_2f0 + 2) = 0;
  local_2d8 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
              ::_M_invoke;
  local_2e8 = 0;
  local_2e0 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
              ::_M_manager;
  local_2d0 = 1;
  local_2c8 = local_2b8;
  local_2c0 = 0;
  local_2b8[0] = 0;
  local_2a8 = 0;
  std::__cxx11::string::_M_replace((ulong)&local_2c8,0,(char *)0x0,0x522f0c);
  local_260 = 0;
  local_588._0_8_ = &local_578;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_588,"maybe_extraTextFormatInfo","");
  local_690._M_dataplus._M_p =
       "\n                              extraTextFormatInfo:extraTextFormatInfo";
  if (local_5c8.entries_.
      super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      local_5c8.entries_.
      super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    local_690._M_dataplus._M_p = "";
  }
  io::Printer::Sub::Sub<char_const*>(&local_258,(string *)local_588,(char **)&local_690);
  local_5a8._M_dataplus._M_p = (pointer)&local_5a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5a8,"enum_flags","");
  bVar4 = EnumDescriptor::is_closed(local_698->descriptor_);
  local_540 = "GPBEnumDescriptorInitializationFlag_None";
  if (bVar4) {
    local_540 = "GPBEnumDescriptorInitializationFlag_IsClosed";
  }
  io::Printer::Sub::Sub<char_const*>(&local_1a0,&local_5a8,&local_540);
  local_608 = &local_5f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_608,"enum_cases","");
  local_e8 = local_d8;
  if (local_608 == &local_5f8) {
    puStack_d0 = apuStack_5f0[0];
  }
  else {
    local_e8 = local_608;
  }
  local_e0 = local_600;
  local_600 = 0;
  local_5f8 = 0;
  local_608 = &local_5f8;
  local_c8 = (undefined8 *)operator_new(0x18);
  *local_c8 = local_698;
  local_c8[1] = &local_670;
  *(undefined1 *)(local_c8 + 2) = 0;
  local_b0 = std::
             _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
             ::_M_invoke;
  local_c0 = 0;
  local_b8 = std::
             _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
             ::_M_manager;
  local_a8 = 1;
  local_a0 = local_90;
  local_98 = 0;
  local_90[0] = 0;
  local_80 = 0;
  std::__cxx11::string::_M_replace((ulong)&local_a0,0,(char *)0x0,0x522f0c);
  local_38 = 0;
  io::Printer::Emit(pPVar3,&local_538,7,0x5b7,
                    "\n        #pragma mark - Enum $name$\n\n        GPBEnumDescriptor *$name$_EnumDescriptor(void) {\n          static _Atomic(GPBEnumDescriptor*) descriptor = nil;\n          if (!descriptor) {\n            static const char *valueNames =\n                $values_name_blob$\n            static const int32_t values[] = {\n                $values$\n            };\n            $maybe_extra_text_format_decl$\n            GPBEnumDescriptor *worker =\n                [GPBEnumDescriptor allocDescriptorForName:GPBNSStringifySymbol($name$)\n                                           runtimeSupport:&$google_protobuf_runtime_support$\n                                               valueNames:valueNames\n                                                   values:values\n                                                    count:(uint32_t)(sizeof(values) / sizeof(int32_t))\n                                             enumVerifier:$name$_IsValidValue\n                                                    flags:$enum_flags$$maybe_extraTextFormatInfo$];\n            GPBEnumDescriptor *expected = nil;\n            if (!atomic_compare_exchange_strong(&descriptor, &expected, worker)) {\n              [worker release];\n            }\n          }\n          return descriptor;\n        }\n\n        BOOL $name$_IsValidValue(int32_t value__) {\n          switch (value__) {\n            $enum_cases$\n              return YES;\n            default:\n              return NO;\n          }\n        }\n      "
                   );
  lVar8 = 0x508;
  do {
    if (*(char *)((long)&local_540 + lVar8) == '\x01') {
      std::_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>::_M_destroy
                ((_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord> *)
                 (local_588 + lVar8 + 8));
    }
    plVar1 = *(long **)((long)&local_5a8._M_dataplus._M_p + lVar8);
    if ((long *)(local_588 + lVar8 + -0x10) != plVar1) {
      operator_delete(plVar1,*(long *)(local_588 + lVar8 + -0x10) + 1);
    }
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>_&>
      ::_S_vtable._M_arr[abStack_5b0[lVar8]]._M_data)
              (&local_699,
               (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
                *)(auStack_5d0 + lVar8));
    abStack_5b0[lVar8] = 0xff;
    if ((long *)((long)&local_5e0 + lVar8) != *(long **)((long)apuStack_5f0 + lVar8)) {
      operator_delete(*(long **)((long)apuStack_5f0 + lVar8),*(long *)((long)&local_5e0 + lVar8) + 1
                     );
    }
    lVar8 = lVar8 + -0xb8;
  } while (lVar8 != 0);
  if (local_608 != &local_5f8) {
    operator_delete(local_608,CONCAT71(uStack_5f7,local_5f8) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5a8._M_dataplus._M_p != &local_5a8.field_2) {
    operator_delete(local_5a8._M_dataplus._M_p,local_5a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_588._0_8_ != &local_578) {
    operator_delete((void *)local_588._0_8_,local_578._M_allocated_capacity + 1);
  }
  if (local_668 != &local_658) {
    operator_delete(local_668,CONCAT71(uStack_657,local_658) + 1);
  }
  if (local_648 != &local_638) {
    operator_delete(local_648,CONCAT71(uStack_637,local_638) + 1);
  }
  if (local_628 != &local_618) {
    operator_delete(local_628,CONCAT71(uStack_617,local_618) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_568._M_dataplus._M_p != &local_568.field_2) {
    operator_delete(local_568._M_dataplus._M_p,local_568.field_2._M_allocated_capacity + 1);
  }
  io::Printer::Emit(local_670,0,0,1,"\n");
  if (apuStack_5f0[1] != &local_5d8) {
    operator_delete(apuStack_5f0[1],CONCAT71(uStack_5d7,local_5d8) + 1);
  }
  std::
  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_5c8.entries_);
  return;
}

Assistant:

void EnumGenerator::GenerateSource(io::Printer* printer) const {
  // Note: For the TextFormat decode info, we can't use the enum value as
  // the key because protocol buffer enums have 'allow_alias', which lets
  // a value be used more than once. Instead, the index into the list of
  // enum value descriptions is used. Note: start with -1 so the first one
  // will be zero.
  TextFormatDecodeData text_format_decode_data;
  int enum_value_description_key = -1;
  std::string text_blob;

  for (const auto* v : all_values_) {
    ++enum_value_description_key;
    std::string short_name(EnumValueShortName(v));
    text_blob += short_name + '\0';
    if (UnCamelCaseEnumShortName(short_name) != v->name()) {
      text_format_decode_data.AddString(enum_value_description_key, short_name,
                                        v->name());
    }
  }

  printer->Emit(
      {{"name", name_},
       {"values_name_blob",
        [&] {
          static const int kBytesPerLine = 40;  // allow for escaping
          for (size_t i = 0; i < text_blob.size(); i += kBytesPerLine) {
            printer->Emit({{"data", EscapeTrigraphs(absl::CEscape(
                                        text_blob.substr(i, kBytesPerLine)))},
                           {"ending_semi",
                            (i + kBytesPerLine) < text_blob.size() ? "" : ";"}},
                          R"objc(
                            "$data$"$ending_semi$
                          )objc");
          }
        }},
       {"values",
        [&] {
          for (const auto* v : all_values_) {
            printer->Emit({{"value_name", EnumValueName(v)}},
                          R"objc(
                            $value_name$,
                          )objc");
          }
        }},
       {"maybe_extra_text_format_decl",
        [&] {
          if (text_format_decode_data.num_entries()) {
            printer->Emit({{"extraTextFormatInfo",
                            absl::CEscape(text_format_decode_data.Data())}},
                          R"objc(
                            static const char *extraTextFormatInfo = "$extraTextFormatInfo$";
                          )objc");
          }
        }},
       {"maybe_extraTextFormatInfo",
        // Could not find a better way to get this extra line inserted and
        // correctly formatted.
        (text_format_decode_data.num_entries() == 0
             ? ""
             : "\n                              "
               "extraTextFormatInfo:extraTextFormatInfo")},
       {"enum_flags", descriptor_->is_closed()
                          ? "GPBEnumDescriptorInitializationFlag_IsClosed"
                          : "GPBEnumDescriptorInitializationFlag_None"},
       {"enum_cases",
        [&] {
          for (const auto* v : base_values_) {
            printer->Emit({{"case_name", EnumValueName(v)}},
                          R"objc(
                            case $case_name$:
                          )objc");
          }
        }}},
      R"objc(
        #pragma mark - Enum $name$

        GPBEnumDescriptor *$name$_EnumDescriptor(void) {
          static _Atomic(GPBEnumDescriptor*) descriptor = nil;
          if (!descriptor) {
            static const char *valueNames =
                $values_name_blob$
            static const int32_t values[] = {
                $values$
            };
            $maybe_extra_text_format_decl$
            GPBEnumDescriptor *worker =
                [GPBEnumDescriptor allocDescriptorForName:GPBNSStringifySymbol($name$)
                                           runtimeSupport:&$google_protobuf_runtime_support$
                                               valueNames:valueNames
                                                   values:values
                                                    count:(uint32_t)(sizeof(values) / sizeof(int32_t))
                                             enumVerifier:$name$_IsValidValue
                                                    flags:$enum_flags$$maybe_extraTextFormatInfo$];
            GPBEnumDescriptor *expected = nil;
            if (!atomic_compare_exchange_strong(&descriptor, &expected, worker)) {
              [worker release];
            }
          }
          return descriptor;
        }

        BOOL $name$_IsValidValue(int32_t value__) {
          switch (value__) {
            $enum_cases$
              return YES;
            default:
              return NO;
          }
        }
      )objc");
  printer->Emit("\n");
}